

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O0

int CheckChecksumUBX(uchar *packet,int packetlen)

{
  uchar local_22;
  uchar local_21;
  int local_20;
  uchar CK_B;
  uchar CK_A;
  int i;
  int packetlen_local;
  uchar *packet_local;
  
  local_21 = '\0';
  local_22 = '\0';
  for (local_20 = 2; local_20 < packetlen + -2; local_20 = local_20 + 1) {
    local_21 = local_21 + packet[local_20];
    local_22 = local_22 + local_21;
  }
  if ((packet[packetlen + -2] == local_21) && (packet[packetlen + -1] == local_22)) {
    packet_local._4_4_ = 0;
  }
  else {
    packet_local._4_4_ = 1;
  }
  return packet_local._4_4_;
}

Assistant:

inline int CheckChecksumUBX(unsigned char* packet, int packetlen)
{
	int i = 0;
	unsigned char CK_A = 0, CK_B = 0;

	for (i = 2; i < packetlen-2; i++)
	{
		CK_A = (unsigned char)(CK_A + packet[i]);
		CK_B = (unsigned char)(CK_B + CK_A);
	}
	if ((packet[packetlen-2] != CK_A)||(packet[packetlen-1] != CK_B))
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}